

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtReadMemory(xmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,
                           int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (buffer == (char *)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    input_00 = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      value = xmlNewIOInputStream(ctxt,input_00,XML_CHAR_ENCODING_NONE);
      if (value == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        inputPush(ctxt,value);
        ctxt_local = (xmlParserCtxtPtr)xmlDoRead(ctxt,URL,encoding,options,1);
      }
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtReadMemory(xmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ctxt == NULL)
        return (NULL);
    if (buffer == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
	return(NULL);
    }

    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }

    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 1));
}